

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::MultiPartInputFile::MultiPartInputFile
          (MultiPartInputFile *this,char *fileName,int numThreads,bool reconstructChunkOffsetTable)

{
  Data *pDVar1;
  StdIFStream *this_00;
  _Rb_tree_header *p_Var2;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__MultiPartInputFile_0049dbe0;
  pDVar1 = (Data *)operator_new(0xa8);
  (pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (pDVar1->super_InputStreamMutex).is = (IStream *)0x0;
  *(undefined8 *)
   ((long)&(pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex + 8) = 0;
  (pDVar1->super_InputStreamMutex).currentPosition = 0;
  pDVar1->deleteStream = true;
  (pDVar1->parts).
  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->parts).
  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->parts).
  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1->numThreads = numThreads;
  pDVar1->reconstructChunkOffsetTable = reconstructChunkOffsetTable;
  p_Var2 = &(pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pDVar1->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_data = pDVar1;
  this_00 = (StdIFStream *)operator_new(0x38);
  StdIFStream::StdIFStream(this_00,fileName);
  (this->_data->super_InputStreamMutex).is = (IStream *)this_00;
  initialize(this);
  return;
}

Assistant:

MultiPartInputFile::MultiPartInputFile(const char fileName[],
                           int numThreads,
                           bool reconstructChunkOffsetTable):
    _data(new Data(true, numThreads, reconstructChunkOffsetTable))
{
    try
    {
        _data->is = new StdIFStream (fileName);
        initialize();
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}